

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# circular-array.h
# Opt level: O0

void __thiscall
wabt::CircularArray<(anonymous_namespace)::TestObject,_2UL>::~CircularArray
          (CircularArray<(anonymous_namespace)::TestObject,_2UL> *this)

{
  CircularArray<(anonymous_namespace)::TestObject,_2UL> *this_local;
  
  clear(this);
  std::array<(anonymous_namespace)::TestObject,_2UL>::~array(&this->contents_);
  return;
}

Assistant:

~CircularArray() { clear(); }